

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * strprepend(char *s,char *pref)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  sVar2 = strlen(pref);
  iVar1 = (int)sVar2;
  if (0x50 < iVar1) {
    warning("PREFIX too short (for %d).",sVar2 & 0xffffffff);
    return s;
  }
  pcVar3 = strncpy(s + -(long)iVar1,pref,(long)iVar1);
  return pcVar3;
}

Assistant:

static char *strprepend(char *s, const char *pref)
{
	int i = (int)strlen(pref);

	if (i > PREFIX) {
		warning("PREFIX too short (for %d).", i);
		return s;
	}
	s -= i;
	strncpy(s, pref, i);	/* do not copy trailing 0 */
	return s;
}